

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void __thiscall
wallet::wallet_tests::coin_mark_dirty_immature_credit::test_method
          (coin_mark_dirty_immature_credit *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  Chain *chain;
  pointer ppCVar1;
  pointer ppCVar2;
  MockableData records;
  Chainstate *pCVar3;
  iterator pvVar4;
  iterator pvVar5;
  undefined ***pppuVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  CTransactionRef tx;
  const_string file;
  const_string file_00;
  undefined8 in_stack_fffffffffffff7b8;
  isminefilter in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c4;
  undefined8 in_stack_fffffffffffff7c8;
  undefined8 in_stack_fffffffffffff7d0;
  undefined8 in_stack_fffffffffffff7d8;
  size_t in_stack_fffffffffffff7e0;
  char *local_818;
  char *local_810;
  isminefilter local_804;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 local_7d0 [24];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  uint256 local_798;
  uint256 local_778;
  undefined **local_758;
  ulong uStack_750;
  undefined1 *local_748;
  char *pcStack_740;
  uint local_738;
  undefined4 local_734;
  undefined1 local_730;
  CWalletTx wtx;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_518;
  CWallet local_4e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wtx,"",(allocator<char> *)&local_758);
  local_518._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_518._M_impl.super__Rb_tree_header._M_header;
  local_518._M_impl._0_8_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_518._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_518._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_color = in_stack_fffffffffffff7c0;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff7b8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = in_stack_fffffffffffff7c4;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff7c8;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff7d0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff7d8;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff7e0;
  local_518._M_impl.super__Rb_tree_header._M_header._M_right =
       local_518._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase(records);
  CWallet::CWallet(&local_4e0,chain,(string *)&wtx,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )((long)local_7d0 + 0x10));
  if ((pointer)local_7d0._16_8_ != (pointer)0x0) {
    (**(code **)(*(long *)(((COutPoint *)local_7d0._16_8_)->hash).m_wrapped.super_base_blob<256U>.
                          m_data._M_elems + 8))();
  }
  local_7d0._16_8_ = (pointer)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_518);
  std::__cxx11::string::~string((string *)&wtx);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock39,&local_4e0.cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x178,false);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x179,"test_method","m_node.chainman");
  pvVar4 = (iterator)0x179;
  pvVar5 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock40,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x179,false);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_7d0,
             &(this->super_TestChain100Setup).m_coinbase_txns.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
                      super_BasicTestingSetup.m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_778,
             (pCVar3->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  local_738 = (int)((ulong)((long)(pCVar3->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pCVar3->m_chain).vChain.
                                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  local_748 = (undefined1 *)local_778.super_base_blob<256U>.m_data._M_elems._16_8_;
  pcStack_740 = (char *)local_778.super_base_blob<256U>.m_data._M_elems._24_8_;
  local_758 = (undefined **)local_778.super_base_blob<256U>.m_data._M_elems._0_8_;
  uStack_750._0_1_ = local_778.super_base_blob<256U>.m_data._M_elems[8];
  uStack_750._1_1_ = local_778.super_base_blob<256U>.m_data._M_elems[9];
  uStack_750._2_1_ = local_778.super_base_blob<256U>.m_data._M_elems[10];
  uStack_750._3_1_ = local_778.super_base_blob<256U>.m_data._M_elems[0xb];
  uStack_750._4_1_ = local_778.super_base_blob<256U>.m_data._M_elems[0xc];
  uStack_750._5_1_ = local_778.super_base_blob<256U>.m_data._M_elems[0xd];
  uStack_750._6_1_ = local_778.super_base_blob<256U>.m_data._M_elems[0xe];
  uStack_750._7_1_ = local_778.super_base_blob<256U>.m_data._M_elems[0xf];
  local_734 = 0;
  local_730 = 0;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_758;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_7d0;
  CWalletTx::CWalletTx(&wtx,tx,(TxState *)(ulong)local_738);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_7d0 + 8));
  CWallet::SetWalletFlag(&local_4e0,0x400000000);
  CWallet::SetupDescriptorScriptPubKeyMans(&local_4e0);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pCVar3->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            (&local_798,
             (pCVar3->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]);
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x10];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x11];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x12];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x13];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x14];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x15];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x16];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x17];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x18];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x19];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_798.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0] =
       local_798.super_base_blob<256U>.m_data._M_elems[0];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[1] =
       local_798.super_base_blob<256U>.m_data._M_elems[1];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[2] =
       local_798.super_base_blob<256U>.m_data._M_elems[2];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[3] =
       local_798.super_base_blob<256U>.m_data._M_elems[3];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[4] =
       local_798.super_base_blob<256U>.m_data._M_elems[4];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[5] =
       local_798.super_base_blob<256U>.m_data._M_elems[5];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[6] =
       local_798.super_base_blob<256U>.m_data._M_elems[6];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[7] =
       local_798.super_base_blob<256U>.m_data._M_elems[7];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[8] =
       local_798.super_base_blob<256U>.m_data._M_elems[8];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[9] =
       local_798.super_base_blob<256U>.m_data._M_elems[9];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[10] =
       local_798.super_base_blob<256U>.m_data._M_elems[10];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_798.super_base_blob<256U>.m_data._M_elems[0xb];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_798.super_base_blob<256U>.m_data._M_elems[0xc];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_798.super_base_blob<256U>.m_data._M_elems[0xd];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_798.super_base_blob<256U>.m_data._M_elems[0xe];
  local_4e0.m_last_block_processed.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_798.super_base_blob<256U>.m_data._M_elems[0xf];
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = pvVar5;
  msg.m_begin = pvVar4;
  file.m_end = (iterator)0x182;
  file.m_begin = (iterator)&local_7e0;
  local_4e0.m_last_block_processed_height = (int)((ulong)((long)ppCVar2 - (long)ppCVar1) >> 3) + -1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7f0,msg);
  uStack_750 = uStack_750 & 0xffffffffffffff00;
  local_758 = &PTR__lazy_ostream_01139f30;
  local_748 = boost::unit_test::lazy_ostream::inst;
  pcStack_740 = "";
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_7f8 = "";
  local_778.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CachedTxGetImmatureCredit(&local_4e0,&wtx,(isminefilter *)&stack0xfffffffffffff7c0);
  pppuVar6 = (undefined ***)&local_778;
  local_804 = 0;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&local_758,&local_800,0x182,1,2,pppuVar6,
             "CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE)",&local_804,"0");
  wtx.m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  wtx.m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  wtx.m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  wtx.m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  wtx.m_is_cache_empty = true;
  wtx.fChangeCached = false;
  AddKey(&local_4e0,&(this->super_TestChain100Setup).coinbaseKey);
  local_818 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_810 = "";
  msg_00.m_end = (iterator)pppuVar6;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x188;
  file_00.m_begin = (iterator)&local_818;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
             (size_t)&stack0xfffffffffffff7d8,msg_00);
  uStack_750 = uStack_750 & 0xffffffffffffff00;
  local_758 = &PTR__lazy_ostream_01139f30;
  local_748 = boost::unit_test::lazy_ostream::inst;
  pcStack_740 = "";
  local_804 = 2;
  local_778.super_base_blob<256U>.m_data._M_elems._0_8_ =
       CachedTxGetImmatureCredit(&local_4e0,&wtx,&local_804);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_758,&stack0xfffffffffffff7c8,0x188,1,2,&local_778,
             "CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE)",&stack0xfffffffffffff7c0,
             "50*COIN");
  CWalletTx::~CWalletTx(&wtx);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock40.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock39.super_unique_lock);
  CWallet::~CWallet(&local_4e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coin_mark_dirty_immature_credit, TestChain100Setup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());

    LOCK(wallet.cs_wallet);
    LOCK(Assert(m_node.chainman)->GetMutex());
    CWalletTx wtx{m_coinbase_txns.back(), TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/0}};
    wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet.SetupDescriptorScriptPubKeyMans();

    wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());

    // Call GetImmatureCredit() once before adding the key to the wallet to
    // cache the current immature credit amount, which is 0.
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 0);

    // Invalidate the cached value, add the key, and make sure a new immature
    // credit amount is calculated.
    wtx.MarkDirty();
    AddKey(wallet, coinbaseKey);
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 50*COIN);
}